

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

Dict * tagsInstall(TidyDocImpl *doc,TidyTagImpl *tags,Dict *old)

{
  uint uVar1;
  DictHash *pDVar2;
  uint hashval;
  DictHash *np;
  Dict *old_local;
  TidyTagImpl *tags_local;
  TidyDocImpl *doc_local;
  
  if (old != (Dict *)0x0) {
    pDVar2 = (DictHash *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x10);
    pDVar2->tag = old;
    uVar1 = tagsHash(old->name);
    pDVar2->next = tags->hashtab[uVar1];
    tags->hashtab[uVar1] = pDVar2;
  }
  return old;
}

Assistant:

static const Dict *tagsInstall(TidyDocImpl* doc, TidyTagImpl* tags, const Dict* old)
{
    DictHash *np;
    uint hashval;

    if (old)
    {
        np = (DictHash *)TidyDocAlloc(doc, sizeof(*np));
        np->tag = old;

        hashval = tagsHash(old->name);
        np->next = tags->hashtab[hashval];
        tags->hashtab[hashval] = np;
    }

    return old;
}